

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *tgtDir,string *relDir)

{
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__lhs;
  pointer __rhs;
  char *cd_cmd;
  string cmd;
  string prefix;
  string outputForExisting;
  char *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  _Var2 = std::operator==(tgtDir,relDir);
  if (!_Var2) {
    bVar3 = cmLocalGenerator::IsMinGWMake((cmLocalGenerator *)this);
    __lhs = "cd ";
    if (bVar3) {
      __lhs = "cd /d ";
    }
    local_90 = __lhs;
    if (*(char *)((long)&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                         [1].LocalGenerators.
                         super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 2) == '\0') {
      cmOutputConverter::ConvertToOutputForExisting
                (&local_48,(cmOutputConverter *)this,tgtDir,SHELL,false);
      cmStrCat<char_const*&,std::__cxx11::string>(&local_88,&local_90,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(commands,(commands->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,&local_88);
      cmOutputConverter::ConvertToOutputForExisting
                (&local_68,(cmOutputConverter *)this,relDir,SHELL,false);
      cmStrCat<char_const*&,std::__cxx11::string>(&local_48,&local_90,&local_68);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 &local_88);
      this_00 = &local_88;
    }
    else {
      cmOutputConverter::ConvertToOutputForExisting
                (&local_48,(cmOutputConverter *)this,tgtDir,SHELL,false);
      std::operator+(&local_88,__lhs,&local_48);
      std::operator+(&local_68,&local_88," && ");
      std::__cxx11::string::~string((string *)&local_88);
      pbVar1 = (commands->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (__rhs = (commands->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
        std::operator+(&local_88,&local_68,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::~string((string *)&local_68);
      this_00 = &local_48;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CreateCDCommand(
  std::vector<std::string>& commands, std::string const& tgtDir,
  std::string const& relDir)
{
  // do we need to cd?
  if (tgtDir == relDir) {
    return;
  }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (!gg->UnixCD) {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd =
      cmStrCat(cd_cmd, this->ConvertToOutputForExisting(tgtDir));
    commands.insert(commands.begin(), cmd);

    // Change back to the starting directory.
    cmd = cmStrCat(cd_cmd, this->ConvertToOutputForExisting(relDir));
    commands.push_back(std::move(cmd));
  } else {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting = this->ConvertToOutputForExisting(tgtDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   [&prefix](std::string const& s) { return prefix + s; });
  }
}